

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::ComputeVertexNormals(ON_Mesh *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int mesh_vertex_count;
  int *__s;
  ON_MeshFace *pOVar6;
  void *pvVar7;
  ON_3fVector *v;
  ON_MeshFace *f_1;
  int *scratch;
  int scratch_sz;
  int **vfi;
  ON_MeshFace *f;
  int *vfcount;
  ON_Workspace ws;
  float fStack_30;
  ON_3fVector n;
  int j;
  int fi;
  int vi;
  int vcount;
  int fcount;
  bool rc;
  ON_Mesh *this_local;
  
  vcount._3_1_ = false;
  iVar5 = FaceCount(this);
  mesh_vertex_count = VertexCount(this);
  if ((0 < iVar5) && (0 < mesh_vertex_count)) {
    vcount._3_1_ = HasFaceNormals(this);
    if (!vcount._3_1_) {
      vcount._3_1_ = ComputeFaceNormals(this);
    }
    if (vcount._3_1_ != false) {
      ON_Workspace::ON_Workspace((ON_Workspace *)&vfcount);
      __s = ON_Workspace::GetIntMemory((ON_Workspace *)&vfcount,(long)mesh_vertex_count);
      memset(__s,0,(long)mesh_vertex_count << 2);
      for (n.z = 0.0; (int)n.z < iVar5; n.z = (float)((int)n.z + 1)) {
        pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,(int)n.z);
        bVar4 = ON_MeshFace::IsValid(pOVar6,mesh_vertex_count);
        if (bVar4) {
          __s[pOVar6->vi[0]] = __s[pOVar6->vi[0]] + 1;
          __s[pOVar6->vi[1]] = __s[pOVar6->vi[1]] + 1;
          __s[pOVar6->vi[2]] = __s[pOVar6->vi[2]] + 1;
          bVar4 = ON_MeshFace::IsQuad(pOVar6);
          if (bVar4) {
            __s[pOVar6->vi[3]] = __s[pOVar6->vi[3]] + 1;
          }
        }
      }
      pvVar7 = ON_Workspace::GetMemory((ON_Workspace *)&vfcount,(long)mesh_vertex_count << 3);
      scratch._4_4_ = 0;
      for (j = 0; j < mesh_vertex_count; j = j + 1) {
        scratch._4_4_ = __s[j] + scratch._4_4_;
      }
      f_1 = (ON_MeshFace *)ON_Workspace::GetIntMemory((ON_Workspace *)&vfcount,(long)scratch._4_4_);
      for (j = 0; j < mesh_vertex_count; j = j + 1) {
        if (__s[j] != 0) {
          *(ON_MeshFace **)((long)pvVar7 + (long)j * 8) = f_1;
          f_1 = (ON_MeshFace *)(f_1->vi + __s[j]);
        }
        __s[j] = 0;
      }
      for (n.z = 0.0; (int)n.z < iVar5; n.z = (float)((int)n.z + 1)) {
        pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,(int)n.z);
        bVar4 = ON_MeshFace::IsValid(pOVar6,mesh_vertex_count);
        if (bVar4) {
          iVar1 = pOVar6->vi[0];
          lVar3 = *(long *)((long)pvVar7 + (long)iVar1 * 8);
          iVar2 = __s[iVar1];
          __s[iVar1] = iVar2 + 1;
          *(float *)(lVar3 + (long)iVar2 * 4) = n.z;
          iVar1 = pOVar6->vi[1];
          lVar3 = *(long *)((long)pvVar7 + (long)iVar1 * 8);
          iVar2 = __s[iVar1];
          __s[iVar1] = iVar2 + 1;
          *(float *)(lVar3 + (long)iVar2 * 4) = n.z;
          iVar1 = pOVar6->vi[2];
          lVar3 = *(long *)((long)pvVar7 + (long)iVar1 * 8);
          iVar2 = __s[iVar1];
          __s[iVar1] = iVar2 + 1;
          *(float *)(lVar3 + (long)iVar2 * 4) = n.z;
          bVar4 = ON_MeshFace::IsQuad(pOVar6);
          if (bVar4) {
            iVar1 = pOVar6->vi[3];
            lVar3 = *(long *)((long)pvVar7 + (long)iVar1 * 8);
            iVar2 = __s[iVar1];
            __s[iVar1] = iVar2 + 1;
            *(float *)(lVar3 + (long)iVar2 * 4) = n.z;
          }
        }
      }
      ON_SimpleArray<ON_3fVector>::SetCapacity
                (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(long)mesh_vertex_count);
      ON_SimpleArray<ON_3fVector>::SetCount(&(this->m_N).super_ON_SimpleArray<ON_3fVector>,0);
      for (j = 0; j < mesh_vertex_count; j = j + 1) {
        ws.m_pMemBlk._4_4_ = ON_3fVector::ZeroVector.x;
        fStack_30 = ON_3fVector::ZeroVector.y;
        n.y = (float)__s[j];
        while (n.y = (float)((int)n.y + -1), -1 < (int)n.y) {
          v = ON_SimpleArray<ON_3fVector>::operator[]
                        (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,
                         *(int *)(*(long *)((long)pvVar7 + (long)j * 8) + (long)(int)n.y * 4));
          ON_3fVector::operator+=((ON_3fVector *)((long)&ws.m_pMemBlk + 4),v);
        }
        bVar4 = ON_3fVector::Unitize((ON_3fVector *)((long)&ws.m_pMemBlk + 4));
        if (!bVar4) {
          ON_3fVector::Set((ON_3fVector *)((long)&ws.m_pMemBlk + 4),0.0,0.0,1.0);
        }
        ON_SimpleArray<ON_3fVector>::Append
                  (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,
                   (ON_3fVector *)((long)&ws.m_pMemBlk + 4));
      }
      ON_Workspace::~ON_Workspace((ON_Workspace *)&vfcount);
    }
  }
  return vcount._3_1_;
}

Assistant:

bool ON_Mesh::ComputeVertexNormals()
{
  bool rc = false;
  const int fcount = FaceCount();
  const int vcount = VertexCount();
  int vi, fi, j;
  ON_3fVector n;

  if ( fcount > 0 && vcount > 0 ) {
    rc = HasFaceNormals();
    if ( !rc )
      rc = ComputeFaceNormals();
    if ( rc ) {
      ON_Workspace ws;
      //double* face_area = ws.GetDoubleMemory(fcount);
      int* vfcount = ws.GetIntMemory( vcount );
      memset ( vfcount, 0, vcount*sizeof(*vfcount) );

      // count number of faces that use each vertex
      for ( fi = 0; fi < fcount; fi++ ) {
        ON_MeshFace& f = m_F[fi];
        if ( f.IsValid(vcount) ) {
          vfcount[f.vi[0]]++;
          vfcount[f.vi[1]]++;
          vfcount[f.vi[2]]++;
          if ( f.IsQuad() )
            vfcount[f.vi[3]]++;
        }
      }

      // set vfi[vi][] = array of face indices that use vertex vi
      int** vfi = (int**)ws.GetMemory( vcount*sizeof(vfi[0] ) );
      {
        int scratch_sz = 0;
        for ( vi = 0; vi < vcount; vi++ ) {
          scratch_sz += vfcount[vi];
        }
        int* scratch = ws.GetIntMemory(scratch_sz);
        for ( vi = 0; vi < vcount; vi++ ) {
          if ( vfcount[vi] ) {
            vfi[vi] = scratch;
            scratch += vfcount[vi];
          }
          vfcount[vi] = 0;
        }
      }
      for ( fi = 0; fi < fcount; fi++ ) {
        ON_MeshFace& f = m_F[fi];
        if ( f.IsValid(vcount) ) {
          vi = f.vi[0]; vfi[vi][vfcount[vi]++] = fi;
          vi = f.vi[1]; vfi[vi][vfcount[vi]++] = fi;
          vi = f.vi[2]; vfi[vi][vfcount[vi]++] = fi;
          if ( f.IsQuad() ) {
            vi = f.vi[3]; vfi[vi][vfcount[vi]++] = fi;
          }
        }
      }

      // average face normals to get an estimate for a vertex normal
      m_N.SetCapacity(vcount);
      m_N.SetCount(0);
      for ( vi = 0; vi < vcount; vi++ )
      {
        n = ON_3fVector::ZeroVector;
        for ( j = vfcount[vi]-1; j >= 0; j-- ) 
        {
          n += m_FN[vfi[vi][j]];
        }
        if ( !n.Unitize() )
        {
          // this vertex is not used by a face or the face normals cancel out.
          // set a unit z normal and press on.
          n.Set(0,0,1);
        }
        m_N.Append(n);
      }
    }
  }
  return rc;
}